

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O1

void __thiscall
KryoFlux::ReadFlux(KryoFlux *this,int revs,FluxData *flux_revs,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *warnings)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *warnings_00;
  FluxData *pFVar1;
  int iVar2;
  void *__s;
  value_type *__val;
  int iVar3;
  long lVar4;
  Data track_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  FluxData *local_a8;
  long *local_a0 [2];
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  FluxData local_60;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  
  iVar2 = 0x14;
  if (revs < 0x14) {
    iVar2 = revs;
  }
  iVar3 = 1;
  if (1 < iVar2) {
    iVar3 = iVar2;
  }
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_c8,1000000);
  __s = operator_new(0x10000);
  memset(__s,0,0x10000);
  (**(code **)(*(long *)this + 0x38))(this);
  (**(code **)(*(long *)this + 0x18))(local_80,this,0xb,iVar3 * 0x100 + 0x101,0);
  local_b0 = warnings;
  local_a8 = flux_revs;
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  do {
    do {
      iVar2 = (**(code **)(*(long *)this + 0x30))(this,__s,0x10000);
      lVar4 = (long)iVar2 + (long)__s;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,
                 local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,__s,lVar4);
    } while (iVar2 < 7);
  } while (*(int *)(lVar4 + -4) != 0xd0d0d0d || *(int *)(lVar4 + -7) != 0xd0d0d0d);
  (**(code **)(*(long *)this + 0x18))(local_a0,this,0xb,0,0);
  pFVar1 = local_a8;
  warnings_00 = local_b0;
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  (**(code **)(*(long *)this + 0x40))(this);
  DecodeStream(&local_60,(Data *)&local_c8,warnings_00);
  local_48.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pFVar1->
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pFVar1->
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pFVar1->
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pFVar1->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_60.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pFVar1->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_60.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pFVar1->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_60.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_60);
  operator_delete(__s,0x10000);
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void KryoFlux::ReadFlux(int revs, FluxData& flux_revs, std::vector<std::string>& warnings)
{
    revs = std::max(1, std::min(revs, 20));

    Data track_data;
    track_data.reserve(1'000'000);
    Data chunk(0x10000);

    // Start reading before we ask for the bulk data.
    StartAsyncRead();

    // Start stream, for 1 more index hole than we require revolutions
    Control(REQ_STREAM, ((revs + 1) << 8) | 0x01);

    for (;;)
    {
        auto len = ReadAsync(chunk.data(), chunk.size());
        track_data.insert(track_data.end(), chunk.begin(), chunk.begin() + len);

        // Check for end marker at end of current packet.
        // ToDo: parse this properly, due to small risk of false positives.
        if (len >= 7 && !memcmp(chunk.data() + len - 7, "\xd\xd\xd\xd\xd\xd\xd", 7))
        {
            // Stop streaming and finish
            Control(REQ_STREAM, 0);
            StopAsyncRead();
            break;
        }
    }

    // Decode the track data to multiple flux revolutions, plus any warnings
    flux_revs = DecodeStream(track_data, warnings);
}